

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CX.hpp
# Opt level: O2

void __thiscall
qclab::qgates::SWAP<float>::apply
          (SWAP<float> *this,Side side,Op op,int nbQubits,SquareMatrix<float> *matrix,int offset)

{
  uint __line;
  char *__assertion;
  int target;
  int control;
  CNOT<float> cnot01;
  CNOT<float> cnot10;
  
  if (nbQubits < 2) {
    __assertion = "nbQubits >= 2";
    __line = 0x24;
  }
  else if (matrix->size_ == (long)(1 << ((byte)nbQubits & 0x1f))) {
    control = (this->qubits_)._M_elems[0] + offset;
    if (control < nbQubits) {
      target = offset + (this->qubits_)._M_elems[1];
      if (target < nbQubits) {
        CX<float>::CX(&cnot01,control,target,1);
        CX<float>::CX(&cnot10,target,control,1);
        CX<float>::apply(&cnot01,side,op,nbQubits,matrix,0);
        CX<float>::apply(&cnot10,side,op,nbQubits,matrix,0);
        CX<float>::apply(&cnot01,side,op,nbQubits,matrix,0);
        CX<float>::~CX(&cnot10);
        CX<float>::~CX(&cnot01);
        return;
      }
      __assertion = "qubit1 < nbQubits";
    }
    else {
      __assertion = "qubit0 < nbQubits";
    }
    __line = 0x28;
  }
  else {
    __assertion = "matrix.size() == 1 << nbQubits";
    __line = 0x25;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/src/qgates/SWAP.cpp"
                ,__line,
                "virtual void qclab::qgates::SWAP<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
               );
}

Assistant:

CX( const int control , const int target ,
                 const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< PauliX< T > >( target ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }